

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall
BMRS_XZ<TTA>::FindRunsMem
          (BMRS_XZ<TTA> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  ulong *puVar5;
  short sVar6;
  ushort uVar7;
  Run *pRVar8;
  Run *pRVar9;
  ulong uVar10;
  ushort uVar11;
  long lVar12;
  unsigned_short uVar13;
  uint uVar14;
  uint64_t *puVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint64_t uVar19;
  ulong *puVar20;
  long lVar21;
  short sVar22;
  Run *pRVar23;
  uint local_9c;
  uint local_90;
  Run *local_70;
  
  lVar4 = (long)data_width;
  uVar19 = *bits_start;
  sVar22 = 0;
  pRVar9 = runs;
  puVar15 = bits_start;
  do {
    lVar17 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
      }
    }
    sVar6 = (short)lVar17;
    if (uVar19 == 0) {
      do {
        puVar15 = puVar15 + 1;
        if (puVar15 == bits_start + lVar4) {
          pRVar9->start_pos = 0xffff;
          pRVar9->end_pos = 0xffff;
          if (height < 2) {
LAB_0024492e:
            uVar3 = TTA::MemFlatten();
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar3;
            return;
          }
          uVar18 = 1;
          local_70 = runs;
LAB_00244604:
          pRVar8 = pRVar9 + 1;
          puVar15 = bits_flag + (uVar18 - 1) * lVar4;
          puVar20 = bits_start + uVar18 * lVar4;
          puVar5 = puVar20 + lVar4;
          uVar10 = *puVar20;
          lVar17 = 0;
          pRVar9 = pRVar8;
          do {
            lVar12 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            lVar16 = lVar17;
            if (uVar10 == 0) {
              do {
                puVar20 = puVar20 + 1;
                if (puVar20 == puVar5) {
                  pRVar9->start_pos = 0xffff;
                  pRVar9->end_pos = 0xffff;
                  uVar18 = uVar18 + 1;
                  local_70 = pRVar8;
                  if (uVar18 != (uint)height) goto LAB_00244604;
                  goto LAB_0024492e;
                }
                lVar16 = lVar17 + 0x40;
                uVar10 = *puVar20;
                lVar12 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                lVar17 = lVar16;
              } while (uVar10 == 0);
            }
            uVar10 = (~uVar10 >> ((byte)lVar12 & 0x3f)) << ((byte)lVar12 & 0x3f);
            lVar21 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            lVar17 = lVar16;
            if (uVar10 == 0) {
              do {
                lVar17 = lVar17 + 0x40;
                puVar1 = puVar20 + 1;
                puVar20 = puVar20 + 1;
                uVar10 = ~*puVar1;
                lVar21 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar11 = (ushort)(lVar12 + lVar16);
            uVar3 = (uint)(lVar12 + lVar16) & 0xffff;
            pRVar23 = local_70;
            do {
              local_70 = pRVar23;
              uVar2 = local_70->end_pos;
              pRVar23 = local_70 + 1;
            } while (uVar2 < uVar3);
            uVar7 = local_70->start_pos;
            uVar13 = (unsigned_short)(lVar21 + lVar17);
            local_90 = (uint)(lVar21 + lVar17);
            uVar14 = local_90 & 0xffff;
            if (uVar14 < uVar7) {
              pRVar9->start_pos = uVar11;
              pRVar9->end_pos = uVar13;
              uVar3 = TTA::MemNewLabel();
              pRVar9->label = uVar3;
            }
            else {
              if (uVar7 <= uVar3) {
                uVar7 = uVar11;
              }
              if (uVar2 < uVar14) {
                local_90 = local_90 & 0xffff;
                uVar19 = is_connected(this,puVar15,(uint)uVar7,(uint)uVar2);
                if (uVar19 == 0) {
                  local_9c = 0;
                }
                else {
                  uVar3 = local_70->label;
                  TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar3] =
                       TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)uVar3] + 1;
                  local_9c = TTA::mem_rtable_.vec_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(int)uVar3];
                }
                uVar2 = pRVar23->start_pos;
                local_70 = pRVar23;
                uVar3 = local_9c;
                while (local_9c = uVar3, uVar2 <= local_90) {
                  if (local_90 <= local_70->end_pos) {
                    uVar19 = is_connected(this,puVar15,(uint)uVar2,local_90);
                    if (uVar19 != 0) {
                      uVar14 = local_70->label;
                      TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)uVar14] =
                           TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[(int)uVar14] + 1;
                      uVar14 = TTA::mem_rtable_.vec_.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[(int)uVar14];
                      if ((uVar3 != uVar14) && (local_9c = uVar14, uVar3 != 0)) {
                        local_9c = TTA::MemMerge(uVar3,uVar14);
                      }
                    }
                    break;
                  }
                  uVar19 = is_connected(this,puVar15,(uint)uVar2,(uint)local_70->end_pos);
                  if (uVar19 != 0) {
                    uVar14 = local_70->label;
                    TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[(int)uVar14] =
                         TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)uVar14] + 1;
                    uVar14 = TTA::mem_rtable_.vec_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(int)uVar14];
                    if ((uVar3 != uVar14) && (local_9c = uVar14, uVar3 != 0)) {
                      local_9c = TTA::MemMerge(uVar3,uVar14);
                    }
                  }
                  pRVar23 = local_70 + 1;
                  local_70 = local_70 + 1;
                  uVar3 = local_9c;
                  uVar2 = pRVar23->start_pos;
                }
                if (local_9c == 0) {
                  local_9c = TTA::MemNewLabel();
                }
                pRVar9->label = local_9c;
                pRVar9->start_pos = uVar11;
                pRVar9->end_pos = uVar13;
              }
              else {
                uVar19 = is_connected(this,puVar15,(uint)uVar7,uVar14);
                if (uVar19 == 0) {
                  uVar3 = TTA::MemNewLabel();
                }
                else {
                  uVar3 = local_70->label;
                  TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar3] =
                       TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)uVar3] + 1;
                  uVar3 = TTA::mem_rtable_.vec_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)uVar3];
                }
                pRVar9->label = uVar3;
                pRVar9->start_pos = uVar11;
                pRVar9->end_pos = uVar13;
              }
            }
            uVar10 = ~uVar10 & -1L << ((byte)lVar21 & 0x3f);
            pRVar9 = pRVar9 + 1;
          } while( true );
        }
        sVar22 = sVar22 + 0x40;
        uVar19 = *puVar15;
        lVar17 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
          }
        }
        sVar6 = (short)lVar17;
      } while (uVar19 == 0);
    }
    uVar18 = (~uVar19 >> ((byte)sVar6 & 0x3f)) << ((byte)sVar6 & 0x3f);
    pRVar9->start_pos = sVar6 + sVar22;
    lVar17 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
      }
    }
    sVar6 = (short)lVar17;
    if (uVar18 == 0) {
      do {
        sVar22 = sVar22 + 0x40;
        puVar20 = puVar15 + 1;
        puVar15 = puVar15 + 1;
        uVar18 = ~*puVar20;
        lVar17 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
          }
        }
        sVar6 = (short)lVar17;
      } while (*puVar20 == 0xffffffffffffffff);
    }
    uVar19 = (~uVar18 >> ((byte)sVar6 & 0x3f)) << ((byte)sVar6 & 0x3f);
    pRVar9->end_pos = sVar6 + sVar22;
    uVar3 = TTA::MemNewLabel();
    pRVar9->label = uVar3;
    pRVar9 = pRVar9 + 1;
  } while( true );
}

Assistant:

void FindRunsMem(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::MemNewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::MemNewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::MemGetLabel(runs_up->label);
                    else runs->label = LabelsSolver::MemNewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::MemGetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::MemGetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::MemMerge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::MemNewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::MemFlatten();
    }